

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::IntType::printTo(IntType *this,ostream *out)

{
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"IntType(",8);
  std::__ostream_insert<char,std::char_traits<char>>(out,"bitWidth=",9);
  duckdb_apache::thrift::to_string<signed_char>(&local_40,&this->bitWidth);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"isSigned=",9);
  duckdb_apache::thrift::to_string<bool>(&local_40,&this->isSigned);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void IntType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "IntType(";
  out << "bitWidth=" << to_string(bitWidth);
  out << ", " << "isSigned=" << to_string(isSigned);
  out << ")";
}